

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ssh2.c
# Opt level: O1

int main(int argc,char **argv)

{
  in_addr_t iVar1;
  uint uVar2;
  int __fd;
  int iVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  ulong extraout_RAX;
  ulong uVar8;
  long lVar9;
  int local_4c;
  long local_48;
  sockaddr_in sin;
  
  pcVar4 = getenv("USER");
  if ((pcVar4 != (char *)0x0) || (pcVar4 = getenv("LOGNAME"), pcVar4 != (char *)0x0)) {
    username = pcVar4;
  }
  pcVar4 = getenv("PRIVKEY");
  if (pcVar4 != (char *)0x0) {
    privkey = pcVar4;
  }
  pcVar4 = getenv("PUBKEY");
  if (pcVar4 != (char *)0x0) {
    pubkey = pcVar4;
  }
  iVar1 = inet_addr("127.0.0.1");
  if (iVar1 == 0xffffffff) {
    main_cold_7();
  }
  else {
    uVar2 = libssh2_init(0);
    if (uVar2 == 0) {
      uVar2 = 1;
      __fd = socket(2,1,0);
      if (__fd == -1) {
        main_cold_6();
        local_4c = 1;
        local_48 = 0;
      }
      else {
        sin.sin_family = 2;
        sin.sin_port = 0x6712;
        uVar8 = 0;
        sin.sin_addr.s_addr = iVar1;
        do {
          iVar3 = connect(__fd,(sockaddr *)&sin,0x10);
          if (iVar3 == 0) break;
          fprintf(_stderr,"Connection to %s:%d attempt #%d failed: retrying...\n","127.0.0.1",0x1267
                  ,uVar8);
          sleep(uVar2);
          uVar8 = (ulong)((int)uVar8 + 1);
          uVar2 = uVar2 + 2;
        } while (uVar2 != 7);
        lVar5 = libssh2_session_init_ex(0,0,0,0);
        if (lVar5 == 0) {
          main_cold_5();
          local_4c = 1;
          local_48 = 0;
        }
        else {
          pcVar4 = getenv("FIXTURE_TRACE_ALL_CONNECT");
          if ((pcVar4 != (char *)0x0) ||
             (pcVar4 = getenv("FIXTURE_TRACE_ALL"), pcVar4 != (char *)0x0)) {
            libssh2_trace(lVar5,0xffffffff);
            fwrite("Trace all enabled.\n",0x13,1,_stdout);
          }
          libssh2_session_set_blocking(lVar5,1);
          uVar2 = libssh2_session_handshake(lVar5,__fd);
          if (uVar2 != 0) {
            fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar2);
          }
          lVar6 = libssh2_hostkey_hash(lVar5,2);
          fwrite("Fingerprint: ",0xd,1,_stderr);
          lVar9 = 0;
          do {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar9));
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x14);
          fputc(10,_stderr);
          pcVar4 = username;
          sVar7 = strlen(username);
          lVar6 = libssh2_userauth_list(lVar5,pcVar4,sVar7 & 0xffffffff);
          if ((lVar6 == 0) || (main_cold_1(), (extraout_RAX & 1) == 0)) {
            lVar6 = libssh2_channel_open_ex(lVar5,"session",7,0x200000,0x8000,0,0);
            local_48 = lVar5;
            if (lVar6 == 0) {
              main_cold_4();
              local_4c = 1;
            }
            else {
              libssh2_channel_setenv_ex(lVar6,"FOO",3,"bar",3);
              iVar3 = libssh2_channel_request_pty_ex(lVar6,"vanilla",7,0,0,0x50,0x18,0,0);
              if (iVar3 == 0) {
                local_4c = 0;
                iVar3 = libssh2_channel_process_startup(lVar6,"shell",5,0,0);
                if (iVar3 != 0) {
                  main_cold_3();
                  local_4c = 1;
                  goto LAB_00101757;
                }
              }
              else {
                main_cold_2();
                local_4c = 1;
              }
              libssh2_channel_free(lVar6);
            }
          }
        }
      }
LAB_00101757:
      if (local_48 != 0) {
        libssh2_session_disconnect_ex(local_48,0xb,"Normal Shutdown","");
        libssh2_session_free(local_48);
      }
      if (__fd != -1) {
        shutdown(__fd,2);
        close(__fd);
      }
      fwrite("all done\n",9,1,_stderr);
      libssh2_exit();
      return local_4c;
    }
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 0;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    unsigned int counter;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    (void)argc;
    (void)argv;

    #ifdef _WIN32
    #define LIBSSH2_FALLBACK_USER_ENV "USERNAME"
    #else
    #define LIBSSH2_FALLBACK_USER_ENV "LOGNAME"
    #endif

    if(getenv("USER"))
        username = getenv("USER");
    else if(getenv(LIBSSH2_FALLBACK_USER_ENV))
        username = getenv(LIBSSH2_FALLBACK_USER_ENV);

    if(getenv("PRIVKEY"))
        privkey = getenv("PRIVKEY");

    if(getenv("PUBKEY"))
        pubkey = getenv("PUBKEY");

    hostaddr = inet_addr(hostname);
    if(hostaddr == (uint32_t)(-1)) {
        fprintf(stderr, "Failed to convert %s host address\n", hostname);
        return 1;
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    rc = 1;

    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons((unsigned short)port_number);
    sin.sin_addr.s_addr = hostaddr;

    for(counter = 0; counter < 3; ++counter) {
        if(connect(sock, (struct sockaddr*)(&sin),
                   sizeof(struct sockaddr_in))) {
            fprintf(stderr,
                    "Connection to %s:%d attempt #%d failed: retrying...\n",
                    hostname, port_number, counter);
            portable_sleep(1 + 2*counter);
        }
        else {
            break;
        }
    }
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "Failed to connect to %s:%d\n",
                hostname, port_number);
        goto shutdown;
    }

    /* Create a session instance and start it up. This will trade welcome
     * banners, exchange keys, and setup crypto, compression, and MAC layers
     */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    if(getenv("FIXTURE_TRACE_ALL_CONNECT") ||
       getenv("FIXTURE_TRACE_ALL")) {
        libssh2_trace(session, ~0);
        fprintf(stdout, "Trace all enabled.\n");
    }

    libssh2_session_set_blocking(session, 1);

    {
        int retries = 0, retry = 0;
#ifdef LIBSSH2_WINCNG
        /* FIXME: Retry tests with WinCNG due to flakiness in hostkey
           verification: https://github.com/libssh2/libssh2/issues/804 */
        retries += 2;
#endif
        do {
            rc = libssh2_session_handshake(session, sock);
            if(rc == 0) {
                break;
            }
            fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
            if(
#ifdef LIBSSH2_WINCNG
               rc != LIBSSH2_ERROR_KEY_EXCHANGE_FAILURE ||
#endif
               ++retry > retries) {
                break;
            }
            fprintf(stderr, "Retrying... %d / %d\n", retry, retries);
        } while(1);
    }

    rc = 1;

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password")) {
            auth_pw |= 1;
        }
        if(strstr(userauthlist, "keyboard-interactive")) {
            auth_pw |= 2;
        }
        if(strstr(userauthlist, "publickey")) {
            auth_pw |= 4;
        }

        if(auth_pw & 4) {
            /* Authenticate by public key */
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found.\n");
            goto shutdown;
        }
    }

    /* Request a session channel on which to run a shell */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Unable to open a session\n");
        goto shutdown;
    }

    /* Some environment variables may be set,
     * It's up to the server which ones it'll allow though
     */
    libssh2_channel_setenv(channel, "FOO", "bar");

    /* Request a terminal with 'vanilla' terminal emulation
     * See /etc/termcap for more options. This is useful when opening
     * an interactive shell.
     */
    if(libssh2_channel_request_pty(channel, "vanilla")) {
        fprintf(stderr, "Failed requesting pty\n");
        goto skip_shell;
    }

    /* Open a SHELL on that pty */
    if(libssh2_channel_shell(channel)) {
        fprintf(stderr, "Unable to request shell on allocated pty\n");
        goto shutdown;
    }

    rc = 0;

skip_shell:

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2 /* SHUT_RDWR */);
#ifdef _WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return rc;
}